

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectoryRecord.hpp
# Opt level: O1

void __thiscall
njoy::ENDFtk::DirectoryRecord::
DirectoryRecord<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (DirectoryRecord *this,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *it,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *end,long *lineNumber,int MAT,int MF,int MT)

{
  int local_30;
  TailVerification<0,njoy::ENDFtk::record::TailVerification<1,njoy::ENDFtk::record::TailVerification<2,njoy::ENDFtk::record::Tail>>>
  local_2c [12];
  
  local_30 = MF;
  record::
  Base<njoy::ENDFtk::record::Integer<33>,njoy::ENDFtk::record::Integer<11>,njoy::ENDFtk::record::Integer<11>,njoy::ENDFtk::record::Integer<11>>
  ::Base<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            ((Base<njoy::ENDFtk::record::Integer<33>,njoy::ENDFtk::record::Integer<11>,njoy::ENDFtk::record::Integer<11>,njoy::ENDFtk::record::Integer<11>>
              *)this,it,end);
  record::
  TailVerification<0,njoy::ENDFtk::record::TailVerification<1,njoy::ENDFtk::record::TailVerification<2,njoy::ENDFtk::record::Tail>>>
  ::
  TailVerification<int&,int&,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>const&,long&>
            (local_2c,MAT,&local_30,&MT,it,end,lineNumber);
  return;
}

Assistant:

DirectoryRecord( Iterator& it, const Iterator& end, long& lineNumber,
                     int MAT, int MF, int MT )

      try : base( it, end ) {

        tail( MAT, MF, MT, it, end, lineNumber );
      }
      catch ( std::exception& e ) {

        throw e;
      }
      catch ( int fieldNo ) {

        --lineNumber;
        throw std::exception();
      }